

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-mod-info.cc
# Opt level: O2

void dumpInfoDict(QPDF *pdf,ostream *os,string *sep)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  ostream *poVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  QPDFObjectHandle trailer;
  string val;
  iterator __begin2;
  iterator __end2;
  string local_50 [32];
  
  QPDF::getTrailer();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&__begin2,"/Info",(allocator<char> *)&__end2);
  cVar1 = QPDFObjectHandle::hasKey((string *)&trailer);
  std::__cxx11::string::~string((string *)&__begin2);
  if (cVar1 != '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&__begin2,"/Info",(allocator<char> *)&val);
    QPDFObjectHandle::getKey((string *)&__end2);
    QPDFObjectHandle::ditems();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&__end2.m);
    std::__cxx11::string::~string((string *)&__begin2);
    QPDFObjectHandle::QPDFDictItems::begin();
    QPDFObjectHandle::QPDFDictItems::end();
    while( true ) {
      bVar2 = QPDFObjectHandle::QPDFDictItems::iterator::operator!=(&__begin2,&__end2);
      if (!bVar2) break;
      uVar3 = QPDFObjectHandle::QPDFDictItems::iterator::operator*[abi_cxx11_();
      val._M_dataplus._M_p = (pointer)&val.field_2;
      val._M_string_length = 0;
      val.field_2._M_local_buf[0] = '\0';
      cVar1 = QPDFObjectHandle::isString();
      if (cVar1 == '\0') {
        cVar1 = QPDFObjectHandle::isName();
        if (cVar1 == '\0') {
          QPDFObjectHandle::unparseResolved_abi_cxx11_();
        }
        else {
          QPDFObjectHandle::getName_abi_cxx11_();
        }
      }
      else {
        QPDFObjectHandle::getStringValue_abi_cxx11_();
      }
      std::__cxx11::string::operator=((string *)&val,local_50);
      std::__cxx11::string::~string(local_50);
      std::__cxx11::string::substr((ulong)local_50,uVar3);
      poVar4 = std::operator<<(os,local_50);
      poVar4 = std::operator<<(poVar4,(string *)sep);
      poVar4 = std::operator<<(poVar4,(string *)&val);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string(local_50);
      std::__cxx11::string::~string((string *)&val);
      QPDFObjectHandle::QPDFDictItems::iterator::operator++(&__begin2);
    }
    QPDFObjectHandle::QPDFDictItems::iterator::~iterator(&__end2);
    QPDFObjectHandle::QPDFDictItems::iterator::~iterator(&__begin2);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&trailer.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void
dumpInfoDict(QPDF& pdf, std::ostream& os = std::cout, std::string const& sep = ":\t")
{
    QPDFObjectHandle trailer = pdf.getTrailer();
    if (trailer.hasKey("/Info")) {
        for (auto& it: trailer.getKey("/Info").ditems()) {
            std::string val;
            if (it.second.isString()) {
                val = it.second.getStringValue();
            } else if (it.second.isName()) {
                val = it.second.getName();
            } else // according to PDF Spec 1.5, shouldn't happen
            {
                val = it.second.unparseResolved();
            }
            os << it.first.substr(1) << sep << val << std::endl; // skip '/'
        }
    }
}